

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ReactorCvode.cpp
# Opt level: O3

int __thiscall pele::physics::reactions::ReactorCvode::init(ReactorCvode *this,EVP_PKEY_CTX *ctx)

{
  ostringstream *this_00;
  int iVar1;
  int iVar2;
  int iVar3;
  Context *pCVar4;
  N_Vector p_Var5;
  void *flagvalue;
  CVODEUserData *pCVar6;
  SUNNonlinearSolver flagvalue_00;
  SUNLinearSolver p_Var7;
  SUNMatrix p_Var8;
  int in_EDX;
  int iVar9;
  char *msg;
  int flag;
  ParmParse pp;
  int local_234;
  Context *local_230;
  Real local_228;
  Real local_220;
  void *local_218;
  ParmParse local_210;
  undefined1 local_1b8 [24];
  undefined8 auStack_1a0 [46];
  
  iVar3 = (int)ctx;
  this->m_reactor_type = iVar3;
  if (1 < iVar3 - 1U) {
    amrex::Abort_host("Wrong reactor type. Choose between 1 (e) or 2 (h).");
  }
  local_1b8._0_8_ = local_1b8 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1b8,"ode","");
  amrex::ParmParse::ParmParse(&local_210,(string *)local_1b8);
  if ((undefined1 *)local_1b8._0_8_ != local_1b8 + 0x10) {
    operator_delete((void *)local_1b8._0_8_,local_1b8._16_8_ + 1);
  }
  amrex::ParmParse::query
            (&local_210,"verbose",
             &(this->super_Register<pele::physics::reactions::ReactorCvode>).super_ReactorBase.
              verbose,0);
  amrex::ParmParse::query(&local_210,"rtol",&this->relTol,0);
  amrex::ParmParse::query(&local_210,"atol",&this->absTol,0);
  amrex::ParmParse::query(&local_210,"atomic_reductions",&this->atomic_reductions,0);
  amrex::ParmParse::query(&local_210,"max_nls_iters",&this->max_nls_iters,0);
  amrex::ParmParse::query(&local_210,"max_fp_accel",&this->max_fp_accel,0);
  amrex::ParmParse::query(&local_210,"clean_init_massfrac",&this->m_clean_init_massfrac,0);
  checkCvodeOptions(this);
  local_1b8._8_8_ = amrex::OutStream();
  this_00 = (ostringstream *)(local_1b8 + 0x10);
  local_1b8._4_4_ = *(undefined4 *)(DAT_0071a620 + -0x48);
  local_1b8._0_4_ = *(undefined4 *)(DAT_0071a620 + -0x30);
  std::__cxx11::ostringstream::ostringstream(this_00);
  *(undefined8 *)((long)auStack_1a0 + *(long *)(local_1b8._16_8_ - 0x18)) =
       *(undefined8 *)(local_1b8._8_8_ + *(long *)(*(long *)local_1b8._8_8_ + -0x18) + 8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,"Initializing CVODE:\n",0x14);
  amrex::Print::~Print((Print *)local_1b8);
  if (this->atomic_reductions == 0) {
    local_1b8._8_8_ = amrex::OutStream();
    local_1b8._4_4_ = *(undefined4 *)(DAT_0071a620 + -0x48);
    local_1b8._0_4_ = *(undefined4 *)(DAT_0071a620 + -0x30);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1b8 + 0x10));
    *(undefined8 *)((long)auStack_1a0 + *(long *)(local_1b8._16_8_ - 0x18)) =
         *(undefined8 *)(local_1b8._8_8_ + *(long *)(*(long *)local_1b8._8_8_ + -0x18) + 8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_1b8 + 0x10),"  Using LDS reductions\n",0x17);
  }
  else {
    local_1b8._8_8_ = amrex::OutStream();
    local_1b8._4_4_ = *(undefined4 *)(DAT_0071a620 + -0x48);
    local_1b8._0_4_ = *(undefined4 *)(DAT_0071a620 + -0x30);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1b8 + 0x10));
    *(undefined8 *)((long)auStack_1a0 + *(long *)(local_1b8._16_8_ - 0x18)) =
         *(undefined8 *)(local_1b8._8_8_ + *(long *)(*(long *)local_1b8._8_8_ + -0x18) + 8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_1b8 + 0x10),"  Using atomic reductions\n",0x1a);
  }
  amrex::Print::~Print((Print *)local_1b8);
  pCVar4 = amrex::sundials::The_Sundials_Context(0);
  iVar2 = in_EDX * 10;
  p_Var5 = N_VNew_Serial(iVar2,*(pCVar4->sunctx_)._M_t.
                                super___uniq_ptr_impl<_SUNContext_*,_std::default_delete<_SUNContext_*>_>
                                ._M_t.
                                super__Tuple_impl<0UL,__SUNContext_**,_std::default_delete<_SUNContext_*>_>
                                .super__Head_base<0UL,__SUNContext_**,_false>._M_head_impl);
  this->y = p_Var5;
  iVar1 = utils::check_flag(p_Var5,"N_VNew_Serial",0);
  iVar9 = 1;
  if (iVar1 != 0) goto LAB_0014948c;
  pCVar4 = amrex::sundials::The_Sundials_Context(0);
  flagvalue = CVodeCreate(2,*(pCVar4->sunctx_)._M_t.
                             super___uniq_ptr_impl<_SUNContext_*,_std::default_delete<_SUNContext_*>_>
                             ._M_t.
                             super__Tuple_impl<0UL,__SUNContext_**,_std::default_delete<_SUNContext_*>_>
                             .super__Head_base<0UL,__SUNContext_**,_false>._M_head_impl);
  this->cvode_mem = flagvalue;
  iVar1 = utils::check_flag(flagvalue,"CVodeCreate",0);
  if (iVar1 != 0) goto LAB_0014948c;
  pCVar6 = (CVODEUserData *)operator_new(0xd8);
  pCVar6->gamma = 0.0;
  pCVar6->nbBlocks = 0;
  pCVar6->nbThreads = 0;
  pCVar6->mask = (int *)0x0;
  pCVar6->FCunt = (int *)0x0;
  pCVar6->rhoesrc_ext = (Real *)0x0;
  pCVar6->rYsrc_ext = (Real *)0x0;
  pCVar6->precond_type = 0;
  pCVar6->NNZ = 0;
  pCVar6->rhoe_init = (Real *)0x0;
  pCVar6->maxOrder = 0;
  pCVar6->reactor_type = 0;
  pCVar6->analytical_jacobian = 0;
  pCVar6->solve_type = 0;
  pCVar6->dt_save = 0.0;
  pCVar6->ncells = 0;
  pCVar6->verbose = 0;
  pCVar6->FirstTimePrecond = false;
  pCVar6->Jdata = (Real **)0x0;
  pCVar6->PS = (SUNMatrix *)0x0;
  pCVar6->rowVals = (int **)0x0;
  pCVar6->rowPtrs = (int **)0x0;
  pCVar6->colPtrs = (int **)0x0;
  pCVar6->colVals = (int **)0x0;
  pCVar6->indx = (int *)0x0;
  pCVar6->JSPSmat = (Real **)0x0;
  pCVar6->Jbd = (Real ****)0x0;
  pCVar6->P = (Real ****)0x0;
  pCVar6->pivot = (sunindextype ***)0x0;
  pCVar6->PSc = (SUNMatrix)0x0;
  pCVar6->colVals_c = (int *)0x0;
  pCVar6->rowPtrs_c = (int *)0x0;
  this->udata_g = pCVar6;
  allocUserData(this,pCVar6,in_EDX);
  iVar1 = utils::check_flag(this->udata_g,"allocUserData",2);
  if (iVar1 != 0) goto LAB_0014948c;
  local_234 = CVodeSetUserData(this->cvode_mem,this->udata_g);
  iVar9 = 1;
  iVar1 = utils::check_flag(&local_234,"CVodeSetUserData",1);
  if (iVar1 != 0) goto LAB_0014948c;
  local_234 = CVodeInit(this->cvode_mem,cF_RHS,0.0,this->y);
  iVar9 = 1;
  iVar1 = utils::check_flag(&local_234,"CVodeInit",1);
  if (iVar1 != 0) goto LAB_0014948c;
  local_230 = amrex::sundials::The_Sundials_Context(0);
  local_218 = this->cvode_mem;
  iVar1 = this->udata_g->ncells;
  local_220 = this->relTol;
  local_228 = this->absTol;
  local_1b8._0_8_ = this_00;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1b8,"cvode","");
  ReactorBase::set_sundials_solver_tols
            ((ReactorBase *)this,local_230,local_218,iVar1,local_220,local_228,(string *)local_1b8);
  if ((ostringstream *)local_1b8._0_8_ != this_00) {
    operator_delete((void *)local_1b8._0_8_,local_1b8._16_8_ + 1);
  }
  pCVar6 = this->udata_g;
  switch(pCVar6->solve_type) {
  case 0:
    p_Var5 = this->y;
    iVar3 = this->max_fp_accel;
    pCVar4 = amrex::sundials::The_Sundials_Context(0);
    flagvalue_00 = SUNNonlinSol_FixedPoint
                             (p_Var5,iVar3,
                              *(pCVar4->sunctx_)._M_t.
                               super___uniq_ptr_impl<_SUNContext_*,_std::default_delete<_SUNContext_*>_>
                               ._M_t.
                               super__Tuple_impl<0UL,__SUNContext_**,_std::default_delete<_SUNContext_*>_>
                               .super__Head_base<0UL,__SUNContext_**,_false>._M_head_impl);
    this->NLS = flagvalue_00;
    iVar3 = utils::check_flag(flagvalue_00,"SUNNonlinSol_FixedPoint",0);
    if (iVar3 != 0) goto LAB_0014948c;
    local_234 = CVodeSetNonlinearSolver(this->cvode_mem,this->NLS);
    iVar3 = utils::check_flag(&local_234,"CVodeSetNonlinearSolver",1);
    break;
  case 1:
  case 2:
    pCVar4 = amrex::sundials::The_Sundials_Context(0);
    p_Var8 = SUNDenseMatrix(iVar2,iVar2,
                            *(pCVar4->sunctx_)._M_t.
                             super___uniq_ptr_impl<_SUNContext_*,_std::default_delete<_SUNContext_*>_>
                             ._M_t.
                             super__Tuple_impl<0UL,__SUNContext_**,_std::default_delete<_SUNContext_*>_>
                             .super__Head_base<0UL,__SUNContext_**,_false>._M_head_impl);
    this->A = p_Var8;
    iVar3 = utils::check_flag(p_Var8,"SUNDenseMatrix",0);
    if (iVar3 != 0) goto LAB_0014948c;
    p_Var5 = this->y;
    p_Var8 = this->A;
    pCVar4 = amrex::sundials::The_Sundials_Context(0);
    p_Var7 = SUNLinSol_Dense(p_Var5,p_Var8,
                             *(pCVar4->sunctx_)._M_t.
                              super___uniq_ptr_impl<_SUNContext_*,_std::default_delete<_SUNContext_*>_>
                              ._M_t.
                              super__Tuple_impl<0UL,__SUNContext_**,_std::default_delete<_SUNContext_*>_>
                              .super__Head_base<0UL,__SUNContext_**,_false>._M_head_impl);
    this->LS = p_Var7;
    iVar3 = utils::check_flag(p_Var7,"SUNLinSol_Dense",0);
    if (iVar3 != 0) goto LAB_0014948c;
    local_234 = CVodeSetLinearSolver(this->cvode_mem,this->LS,this->A);
    iVar3 = utils::check_flag(&local_234,"CVodeSetLinearSolver",1);
    break;
  case 3:
    msg = "sparseDirect solver_type not valid without KLU library.";
    goto LAB_00149635;
  case 4:
    iVar1 = pCVar6->ncells;
    iVar9 = pCVar6->NNZ;
    pCVar4 = amrex::sundials::The_Sundials_Context(0);
    p_Var8 = SUNSparseMatrix(iVar2,iVar2,iVar1 * iVar9,1,
                             *(pCVar4->sunctx_)._M_t.
                              super___uniq_ptr_impl<_SUNContext_*,_std::default_delete<_SUNContext_*>_>
                              ._M_t.
                              super__Tuple_impl<0UL,__SUNContext_**,_std::default_delete<_SUNContext_*>_>
                              .super__Head_base<0UL,__SUNContext_**,_false>._M_head_impl);
    this->A = p_Var8;
    iVar2 = utils::check_flag(p_Var8,"SUNDenseMatrix",0);
    iVar9 = 1;
    if (iVar2 != 0) goto LAB_0014948c;
    p_Var5 = this->y;
    p_Var8 = this->A;
    iVar2 = this->udata_g->ncells;
    local_230 = (Context *)CONCAT44(local_230._4_4_,this->udata_g->NNZ);
    pCVar4 = amrex::sundials::The_Sundials_Context(0);
    p_Var7 = cvode::SUNLinSol_sparse_custom
                       (p_Var5,p_Var8,iVar3,iVar2,10,(int)local_230,
                        *(pCVar4->sunctx_)._M_t.
                         super___uniq_ptr_impl<_SUNContext_*,_std::default_delete<_SUNContext_*>_>.
                         _M_t.
                         super__Tuple_impl<0UL,__SUNContext_**,_std::default_delete<_SUNContext_*>_>
                         .super__Head_base<0UL,__SUNContext_**,_false>._M_head_impl);
    this->LS = p_Var7;
    iVar3 = utils::check_flag(p_Var7,"SUNLinSol_sparse_custom",0);
    if (iVar3 != 0) goto LAB_0014948c;
    local_234 = CVodeSetLinearSolver(this->cvode_mem,this->LS,this->A);
    iVar3 = utils::check_flag(&local_234,"CVodeSetLinearSolver",1);
    break;
  case 5:
    p_Var5 = this->y;
    pCVar4 = amrex::sundials::The_Sundials_Context(0);
    p_Var7 = SUNLinSol_SPGMR(p_Var5,0,0,
                             *(pCVar4->sunctx_)._M_t.
                              super___uniq_ptr_impl<_SUNContext_*,_std::default_delete<_SUNContext_*>_>
                              ._M_t.
                              super__Tuple_impl<0UL,__SUNContext_**,_std::default_delete<_SUNContext_*>_>
                              .super__Head_base<0UL,__SUNContext_**,_false>._M_head_impl);
    this->LS = p_Var7;
    iVar3 = utils::check_flag(p_Var7,"SUNLinSol_SPGMR",0);
    if (iVar3 != 0) goto LAB_0014948c;
    local_234 = CVodeSetLinearSolver(this->cvode_mem,this->LS,(SUNMatrix)0x0);
    iVar3 = utils::check_flag(&local_234,"CVodeSetLinearSolver",1);
    break;
  case 6:
    p_Var5 = this->y;
    pCVar4 = amrex::sundials::The_Sundials_Context(0);
    p_Var7 = SUNLinSol_SPGMR(p_Var5,1,0,
                             *(pCVar4->sunctx_)._M_t.
                              super___uniq_ptr_impl<_SUNContext_*,_std::default_delete<_SUNContext_*>_>
                              ._M_t.
                              super__Tuple_impl<0UL,__SUNContext_**,_std::default_delete<_SUNContext_*>_>
                              .super__Head_base<0UL,__SUNContext_**,_false>._M_head_impl);
    this->LS = p_Var7;
    iVar3 = utils::check_flag(p_Var7,"SUNLinSol_SPGMR",0);
    iVar9 = 1;
    if (iVar3 != 0) goto LAB_0014948c;
    local_234 = CVodeSetLinearSolver(this->cvode_mem,this->LS,(SUNMatrix)0x0);
    iVar3 = utils::check_flag(&local_234,"CVodeSetLinearSolver",1);
    break;
  default:
    msg = "Wrong choice of linear solver...";
LAB_00149635:
    amrex::Abort_host(msg);
    goto LAB_001498ab;
  }
  iVar9 = 1;
  if (iVar3 != 0) goto LAB_0014948c;
LAB_001498ab:
  if (this->udata_g->analytical_jacobian == 1) {
    iVar3 = this->udata_g->solve_type;
    if (iVar3 == 4) {
      local_234 = CVodeSetJacFn(this->cvode_mem,cvode::cJac_sps);
      iVar3 = utils::check_flag(&local_234,"CVodeSetJacFn",1);
LAB_0014993e:
      iVar9 = 1;
      if (iVar3 != 0) goto LAB_0014948c;
    }
    else if (iVar3 == 3) {
      amrex::Abort_host(
                       "Shouldn\'t be there: sparseDirect solver_type not valid without KLU library."
                       );
    }
    else if (iVar3 == 2) {
      local_234 = CVodeSetJacFn(this->cvode_mem,cvode::cJac);
      iVar3 = utils::check_flag(&local_234,"CVodeSetJacFn",1);
      goto LAB_0014993e;
    }
  }
  iVar3 = this->udata_g->precond_type;
  if (iVar3 == 2) {
    local_234 = CVodeSetJacTimes(this->cvode_mem,(CVLsJacTimesSetupFn)0x0,(CVLsJacTimesVecFn)0x0);
    iVar9 = 1;
    iVar3 = utils::check_flag(&local_234,"CVodeSetJacTimes",1);
    if (iVar3 != 0) goto LAB_0014948c;
    local_234 = CVodeSetPreconditioner(this->cvode_mem,cvode::Precond_custom,cvode::PSolve_custom);
    iVar3 = utils::check_flag(&local_234,"CVodeSetPreconditioner",1);
LAB_00149a4e:
    iVar9 = 1;
    if (iVar3 != 0) goto LAB_0014948c;
  }
  else if (iVar3 == 1) {
    amrex::Abort_host("sparseSimpleAJac precond_type not valid without KLU library.");
  }
  else if (iVar3 == 0) {
    local_234 = CVodeSetJacTimes(this->cvode_mem,(CVLsJacTimesSetupFn)0x0,(CVLsJacTimesVecFn)0x0);
    iVar9 = 1;
    iVar3 = utils::check_flag(&local_234,"CVodeSetJacTimes",1);
    if (iVar3 != 0) goto LAB_0014948c;
    local_234 = CVodeSetPreconditioner(this->cvode_mem,cvode::Precond,cvode::PSolve);
    iVar3 = utils::check_flag(&local_234,"CVodeSetPreconditioner",1);
    goto LAB_00149a4e;
  }
  local_234 = CVodeSetMaxNonlinIters(this->cvode_mem,this->max_nls_iters);
  iVar9 = 1;
  iVar3 = utils::check_flag(&local_234,"CVodeSetMaxNonlinIters",1);
  if (iVar3 == 0) {
    local_234 = CVodeSetMaxErrTestFails(this->cvode_mem,100);
    iVar9 = 1;
    iVar3 = utils::check_flag(&local_234,"CVodeSetMaxErrTestFails",1);
    if (iVar3 == 0) {
      local_234 = CVodeSetErrHandlerFn(this->cvode_mem,cvode::cvodeErrHandler,(void *)0x0);
      iVar9 = 1;
      iVar3 = utils::check_flag(&local_234,"CVodeSetErrHandlerFn",1);
      if (iVar3 == 0) {
        local_234 = CVodeSetMaxNumSteps(this->cvode_mem,10000);
        iVar9 = 1;
        iVar3 = utils::check_flag(&local_234,"CVodeSetMaxNumSteps",1);
        if (iVar3 == 0) {
          local_234 = CVodeSetMaxOrd(this->cvode_mem,this->udata_g->maxOrder);
          iVar9 = 1;
          iVar3 = utils::check_flag(&local_234,"CVodeSetMaxOrd",1);
          if (iVar3 == 0) {
            if (this->LS != (SUNLinearSolver)0x0) {
              local_234 = CVodeSetJacEvalFrequency(this->cvode_mem,100);
              iVar9 = 1;
              iVar3 = utils::check_flag(&local_234,"CVodeSetJacEvalFrequency",1);
              if (iVar3 != 0) goto LAB_0014948c;
            }
            iVar9 = 0;
          }
        }
      }
    }
  }
LAB_0014948c:
  std::
  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~deque((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&local_210);
  return iVar9;
}

Assistant:

int
ReactorCvode::init(int reactor_type, int ncells)
{
  BL_PROFILE("Pele::ReactorCvode::init()");
  m_reactor_type = reactor_type;
  ReactorTypes::check_reactor_type(m_reactor_type);
  amrex::ParmParse pp("ode");
  pp.query("verbose", verbose);
  pp.query("rtol", relTol);
  pp.query("atol", absTol);
  pp.query("atomic_reductions", atomic_reductions);
  pp.query("max_nls_iters", max_nls_iters);
  pp.query("max_fp_accel", max_fp_accel);
  pp.query("clean_init_massfrac", m_clean_init_massfrac);
  checkCvodeOptions();

  amrex::Print() << "Initializing CVODE:\n";

  if (atomic_reductions != 0) {
    amrex::Print() << "  Using atomic reductions\n";
  } else {
    amrex::Print() << "  Using LDS reductions\n";
  }

#ifndef AMREX_USE_GPU
  // ----------------------------------------------------------
  // On CPU, initialize cvode_mem/userData
  // ----------------------------------------------------------

  // Solution vector
  int neq_tot = (NUM_SPECIES + 1) * ncells;
  y = N_VNew_Serial(neq_tot, *amrex::sundials::The_Sundials_Context());
  if (utils::check_flag(static_cast<void*>(y), "N_VNew_Serial", 0) != 0) {
    return (1);
  }

  // Call CVodeCreate to create the solver memory and specify the Backward
  // Differentiation Formula and the use of a Newton iteration
  cvode_mem = CVodeCreate(CV_BDF, *amrex::sundials::The_Sundials_Context());
  if (utils::check_flag(static_cast<void*>(cvode_mem), "CVodeCreate", 0) != 0) {
    return (1);
  }

  udata_g = new CVODEUserData{};
  allocUserData(udata_g, ncells);
  if (utils::check_flag(static_cast<void*>(udata_g), "allocUserData", 2) != 0) {
    return (1);
  }

  // Set the pointer to user-defined data
  int flag = CVodeSetUserData(cvode_mem, udata_g);
  if (utils::check_flag(&flag, "CVodeSetUserData", 1) != 0) {
    return (1);
  }

  // Call CVodeInit to initialize the integrator memory and specify the user's
  // right hand side function, the inital time, and initial dependent variable
  // vector y.
  amrex::Real time = 0.0;
  flag = CVodeInit(cvode_mem, cF_RHS, time, y);
  if (utils::check_flag(&flag, "CVodeInit", 1) != 0) {
    return (1);
  }

  // Setup tolerances
  set_sundials_solver_tols(
    *amrex::sundials::The_Sundials_Context(), cvode_mem, udata_g->ncells,
    relTol, absTol, "cvode");

  // Linear solver data
  if (udata_g->solve_type == cvode::fixedPoint) {
    NLS = SUNNonlinSol_FixedPoint(
      y, max_fp_accel, *amrex::sundials::The_Sundials_Context());
    if (utils::check_flag(
          static_cast<void*>(NLS), "SUNNonlinSol_FixedPoint", 0)) {
      return (1);
    }

    flag = CVodeSetNonlinearSolver(cvode_mem, NLS);
    if (utils::check_flag(&flag, "CVodeSetNonlinearSolver", 1)) {
      return (1);
    }

  } else if (
    udata_g->solve_type == cvode::denseFDDirect ||
    udata_g->solve_type == cvode::denseDirect) {
    // Create dense SUNMatrix for use in linear solves
    A = SUNDenseMatrix(
      neq_tot, neq_tot, *amrex::sundials::The_Sundials_Context());
    if (utils::check_flag(static_cast<void*>(A), "SUNDenseMatrix", 0) != 0) {
      return (1);
    }

    // Create dense SUNLinearSolver object for use by CVode
    LS = SUNLinSol_Dense(y, A, *amrex::sundials::The_Sundials_Context());
    if (utils::check_flag(static_cast<void*>(LS), "SUNLinSol_Dense", 0) != 0) {
      return (1);
    }

    // Call CVodeSetLinearSolver to attach the matrix and linear solver to CVode
    flag = CVodeSetLinearSolver(cvode_mem, LS, A);
    if (utils::check_flag(&flag, "CVodeSetLinearSolver", 1) != 0) {
      return (1);
    }

  } else if (udata_g->solve_type == cvode::sparseDirect) {
#ifdef PELE_USE_KLU
    // Create sparse SUNMatrix for use in linear solves
    A = SUNSparseMatrix(
      neq_tot, neq_tot, (udata_g->NNZ) * udata_g->ncells, CSC_MAT,
      *amrex::sundials::The_Sundials_Context());
    if (utils::check_flag(static_cast<void*>(A), "SUNSparseMatrix", 0))
      return (1);

    // Create KLU solver object for use by CVode
    LS = SUNLinSol_KLU(y, A, *amrex::sundials::The_Sundials_Context());
    if (utils::check_flag(static_cast<void*>(LS), "SUNLinSol_KLU", 0))
      return (1);

    // Call CVodeSetLinearSolver to attach the matrix and linear solver to CVode
    flag = CVodeSetLinearSolver(cvode_mem, LS, A);
    if (utils::check_flag(&flag, "CVodeSetLinearSolver", 1))
      return (1);
#else
    amrex::Abort("sparseDirect solver_type not valid without KLU library.");
#endif

  } else if (udata_g->solve_type == cvode::customDirect) {
    // Create dense SUNMatrix for use in linear solves
    A = SUNSparseMatrix(
      neq_tot, neq_tot, (udata_g->NNZ) * udata_g->ncells, CSR_MAT,
      *amrex::sundials::The_Sundials_Context());
    if (utils::check_flag(static_cast<void*>(A), "SUNDenseMatrix", 0) != 0) {
      return (1);
    }

    // Create dense SUNLinearSolver object for use by CVode
    LS = cvode::SUNLinSol_sparse_custom(
      y, A, reactor_type, udata_g->ncells, (NUM_SPECIES + 1), udata_g->NNZ,
      *amrex::sundials::The_Sundials_Context());
    if (
      utils::check_flag(static_cast<void*>(LS), "SUNLinSol_sparse_custom", 0) !=
      0) {
      return (1);
    }

    // Call CVodeSetLinearSolver to attach the matrix and linear solver to CVode
    flag = CVodeSetLinearSolver(cvode_mem, LS, A);
    if (utils::check_flag(&flag, "CVodeSetLinearSolver", 1) != 0) {
      return (1);
    }

  } else if (udata_g->solve_type == cvode::GMRES) {
    // Create the GMRES linear solver object
    LS = SUNLinSol_SPGMR(
      y, SUN_PREC_NONE, 0, *amrex::sundials::The_Sundials_Context());
    if (utils::check_flag(static_cast<void*>(LS), "SUNLinSol_SPGMR", 0) != 0) {
      return (1);
    }

    // Set CVode linear solver to LS
    flag = CVodeSetLinearSolver(cvode_mem, LS, nullptr);
    if (utils::check_flag(&flag, "CVodeSetLinearSolver", 1) != 0) {
      return (1);
    }

  } else if (udata_g->solve_type == cvode::precGMRES) {
    // Create the GMRES linear solver object
    LS = SUNLinSol_SPGMR(
      y, SUN_PREC_LEFT, 0, *amrex::sundials::The_Sundials_Context());
    if (utils::check_flag(static_cast<void*>(LS), "SUNLinSol_SPGMR", 0) != 0) {
      return (1);
    }

    // Set CVode linear solver to LS
    flag = CVodeSetLinearSolver(cvode_mem, LS, nullptr);
    if (utils::check_flag(&flag, "CVodeSetLinearSolver", 1) != 0) {
      return (1);
    }

  } else {
    amrex::Abort("Wrong choice of linear solver...");
  }

  // Analytical Jac. data for direct solver
  if (udata_g->analytical_jacobian == 1) {
    if (udata_g->solve_type == cvode::denseDirect) {
      // Set the user-supplied Jacobian routine Jac
      flag = CVodeSetJacFn(cvode_mem, cvode::cJac);
      if (utils::check_flag(&flag, "CVodeSetJacFn", 1) != 0) {
        return (1);
      }
    } else if (udata_g->solve_type == cvode::sparseDirect) {
#ifdef PELE_USE_KLU
      // Set the user-supplied KLU Jacobian routine Jac
      flag = CVodeSetJacFn(cvode_mem, cvode::cJac_KLU);
      if (utils::check_flag(&flag, "CVodeSetJacFn", 1))
        return (1);
#else
      amrex::Abort(
        "Shouldn't be there: sparseDirect solver_type not valid without "
        "KLU library.");
#endif
    } else if (udata_g->solve_type == cvode::customDirect) {
      // Set the user-supplied Jacobian routine Jac
      flag = CVodeSetJacFn(cvode_mem, cvode::cJac_sps);
      if (utils::check_flag(&flag, "CVodeSetJacFn", 1) != 0) {
        return (1);
      }
    }
  }

  // Analytical Jac. data for iterative solver preconditioner
  if (udata_g->precond_type == cvode::denseSimpleAJac) {
    // Set the JAcobian-times-vector function
    flag = CVodeSetJacTimes(cvode_mem, nullptr, nullptr);
    if (utils::check_flag(&flag, "CVodeSetJacTimes", 1) != 0) {
      return (1);
    }
    // Set the preconditioner plain dense solve and setup functions
    flag = CVodeSetPreconditioner(cvode_mem, cvode::Precond, cvode::PSolve);
    if (utils::check_flag(&flag, "CVodeSetPreconditioner", 1) != 0) {
      return (1);
    }
  } else if (udata_g->precond_type == cvode::sparseSimpleAJac) {
#ifdef PELE_USE_KLU
    // Set the JAcobian-times-vector function
    flag = CVodeSetJacTimes(cvode_mem, nullptr, nullptr);
    if (utils::check_flag(&flag, "CVodeSetJacTimes", 1))
      return (1);
    // Set the preconditioner KLU sparse solve and setup functions
    flag = CVodeSetPreconditioner(
      cvode_mem, cvode::Precond_sparse, cvode::PSolve_sparse);
    if (utils::check_flag(&flag, "CVodeSetPreconditioner", 1))
      return (1);
#else
    amrex::Abort(
      "sparseSimpleAJac precond_type not valid without KLU library.");
#endif
  } else if (udata_g->precond_type == cvode::customSimpleAJac) {
    // Set the JAcobian-times-vector function
    flag = CVodeSetJacTimes(cvode_mem, nullptr, nullptr);
    if (utils::check_flag(&flag, "CVodeSetJacTimes", 1) != 0) {
      return (1);
    }
    // Set the preconditioner to custom solve and setup functions
    flag = CVodeSetPreconditioner(
      cvode_mem, cvode::Precond_custom, cvode::PSolve_custom);
    if (utils::check_flag(&flag, "CVodeSetPreconditioner", 1) != 0) {
      return (1);
    }
  }

  // CVODE runtime options
  flag = CVodeSetMaxNonlinIters(cvode_mem, max_nls_iters); // Max newton iter.
  if (utils::check_flag(&flag, "CVodeSetMaxNonlinIters", 1) != 0) {
    return (1);
  }
  flag = CVodeSetMaxErrTestFails(cvode_mem, 100); // Max Err.test failure
  if (utils::check_flag(&flag, "CVodeSetMaxErrTestFails", 1) != 0) {
    return (1);
  }
  flag = CVodeSetErrHandlerFn(
    cvode_mem, cvode::cvodeErrHandler, nullptr); // Err. handler funct.
  if (utils::check_flag(&flag, "CVodeSetErrHandlerFn", 1) != 0) {
    return (1);
  }
  flag = CVodeSetMaxNumSteps(cvode_mem, 10000); // Max substeps
  if (utils::check_flag(&flag, "CVodeSetMaxNumSteps", 1) != 0) {
    return (1);
  }
  flag = CVodeSetMaxOrd(cvode_mem, udata_g->maxOrder); // Max order
  if (utils::check_flag(&flag, "CVodeSetMaxOrd", 1) != 0) {
    return (1);
  }
  if (LS != nullptr) {
    flag = CVodeSetJacEvalFrequency(cvode_mem, 100); // Max Jac age
    if (utils::check_flag(&flag, "CVodeSetJacEvalFrequency", 1) != 0) {
      return (1);
    }
  }

  // End of CPU section
#endif

  return (0);
}